

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

void Gia_ManPrintMappingStats(Gia_Man_t *p,char *pDumpFile)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  char *__s2;
  uint uVar4;
  int iVar5;
  uint uVar6;
  void *__ptr;
  FILE *__stream;
  uint uVar7;
  int iVar8;
  abctime aVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  size_t __nmemb;
  bool bVar17;
  int pFanins [3];
  timespec local_58;
  float local_44;
  Gia_Man_t *local_40;
  char *local_38;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    return;
  }
  iVar5 = p->nObjs;
  __nmemb = (size_t)iVar5;
  local_38 = pDumpFile;
  __ptr = calloc(__nmemb,4);
  if ((long)__nmemb < 2) {
    uVar6 = 0;
    bVar17 = true;
    uVar15 = 0;
    uVar14 = 0;
    uVar11 = 0;
  }
  else {
    iVar8 = 0;
    lVar16 = 1;
    uVar10 = 0;
    uVar11 = 0;
    uVar14 = 0;
    uVar15 = 0;
    uVar6 = 0;
    local_40 = p;
    do {
      uVar7 = p->vMapping->nSize;
      if ((int)uVar7 <= lVar16) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = p->vMapping->pArray;
      uVar4 = piVar2[lVar16];
      uVar12 = (ulong)uVar4;
      if (uVar12 != 0) {
        if (((int)uVar4 < 0) || (uVar7 <= uVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        uVar7 = piVar2[uVar12];
        if ((piVar2 + uVar12)[(long)(int)uVar7 + 1] < 0) {
          if (uVar7 == 2) {
            uVar7 = *(uint *)((long)__ptr + lVar16 * 4);
            uVar3 = *(undefined8 *)(p->pObjs + lVar16);
            uVar4 = *(uint *)((long)__ptr +
                             (long)(int)((int)lVar16 - ((uint)uVar3 & 0x1fffffff)) * 4);
            if ((int)uVar4 < (int)uVar7) {
              uVar4 = uVar7;
            }
            *(uint *)((long)__ptr + lVar16 * 4) = uVar4;
            uVar7 = *(uint *)((long)__ptr +
                             (long)(int)((int)lVar16 - ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))
                             * 4);
            if ((int)uVar4 <= (int)uVar7) {
              uVar4 = uVar7;
            }
            *(uint *)((long)__ptr + lVar16 * 4) = uVar4;
          }
          else if (uVar7 == 3) {
            Gia_ManPrintGetMuxFanins(p,p->pObjs + lVar16,(int *)&local_58);
            uVar10 = *(uint *)((long)__ptr + lVar16 * 4);
            uVar4 = *(int *)((long)__ptr + (long)(int)local_58.tv_sec * 4) + 1;
            if ((int)uVar4 < (int)uVar10) {
              uVar4 = uVar10;
            }
            *(uint *)((long)__ptr + lVar16 * 4) = uVar4;
            uVar10 = *(uint *)((long)__ptr + (long)local_58.tv_sec._4_4_ * 4);
            if ((int)uVar4 <= (int)uVar10) {
              uVar4 = uVar10;
            }
            *(uint *)((long)__ptr + lVar16 * 4) = uVar4;
            uVar10 = *(uint *)((long)__ptr + (long)(int)local_58.tv_nsec * 4);
            if ((int)uVar4 <= (int)uVar10) {
              uVar4 = uVar10;
            }
            *(uint *)((long)__ptr + lVar16 * 4) = uVar4;
            __nmemb = (size_t)(uint)local_40->nObjs;
            p = local_40;
            uVar10 = uVar11;
          }
          else {
            uVar4 = *(uint *)((long)__ptr + lVar16 * 4);
          }
          if ((int)uVar11 <= (int)uVar4) {
            uVar10 = uVar4;
          }
          uVar14 = (ulong)((int)uVar14 + 1);
          iVar8 = iVar8 + 1;
          uVar11 = uVar10;
        }
        else {
          if ((int)uVar6 <= (int)uVar7) {
            uVar6 = uVar7;
          }
          iVar5 = *(int *)((long)__ptr + lVar16 * 4);
          if (0 < (int)uVar7) {
            lVar13 = 0;
            do {
              iVar1 = *(int *)((long)__ptr + (long)piVar2[uVar12 + lVar13 + 1] * 4);
              if (iVar5 <= iVar1) {
                iVar5 = iVar1;
              }
              *(int *)((long)__ptr + lVar16 * 4) = iVar5;
              lVar13 = lVar13 + 1;
            } while ((int)uVar7 != lVar13);
          }
          uVar15 = (ulong)((int)uVar15 + 1);
          uVar14 = (ulong)((int)uVar14 + uVar7);
          uVar7 = iVar5 + 1;
          *(uint *)((long)__ptr + lVar16 * 4) = uVar7;
          if ((int)uVar11 <= (int)uVar7) {
            uVar11 = uVar7;
            uVar10 = uVar7;
          }
        }
      }
      lVar16 = lVar16 + 1;
      iVar5 = (int)__nmemb;
    } while (lVar16 < iVar5);
    bVar17 = iVar8 == 0;
  }
  lVar16 = (long)p->vCos->nSize;
  if (lVar16 < 1) {
    local_44 = 0.0;
  }
  else {
    lVar13 = 0;
    iVar8 = 0;
    do {
      iVar1 = p->vCos->pArray[lVar13];
      if (((long)iVar1 < 0) || (iVar5 <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar8 = iVar8 + *(int *)((long)__ptr +
                              (long)(int)(iVar1 - (*(uint *)(p->pObjs + iVar1) & 0x1fffffff)) * 4);
      lVar13 = lVar13 + 1;
    } while (lVar16 != lVar13);
    local_44 = (float)iVar8;
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  Abc_Print(1,"Mapping (K=%d)  :  ",(ulong)uVar6);
  Abc_Print(1,"%slut =%7d%s  ","\x1b[1;33m",uVar15,"\x1b[0m");
  Abc_Print(1,"%sedge =%8d%s  ","\x1b[1;32m",uVar14,"\x1b[0m");
  Abc_Print(1,"%slev =%5d%s ","\x1b[1;31m",(ulong)uVar11,"\x1b[0m");
  Abc_Print(1,"%s(%.2f)%s  ",(double)(local_44 / (float)p->vCos->nSize),"\x1b[1;31m","\x1b[0m");
  if (((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) &&
     (iVar5 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar5 != 0)) {
    uVar6 = Gia_ManLutLevelWithBoxes(p);
    Abc_Print(1,"%slevB =%5d%s  ","\x1b[1;31m",(ulong)uVar6,"\x1b[0m");
  }
  Abc_Print(1,"mem =%5.2f MB",
            (double)((int)uVar14 + (int)uVar15 * 2 + p->nObjs) * 4.0 * 9.5367431640625e-07);
  Abc_Print(1,"\n");
  if (!bVar17) {
    Gia_ManCountDupLut(p);
  }
  if (local_38 == (char *)0x0) {
    return;
  }
  __stream = fopen(local_38,"a+");
  __s2 = p->pName;
  iVar5 = strcmp(Gia_ManPrintMappingStats::FileNameOld,__s2);
  if (iVar5 == 0) {
    fputc(0x20,__stream);
    fprintf(__stream,"%d ",uVar15);
    uVar6 = Gia_ManLutLevelWithBoxes(p);
    fprintf(__stream,"%d ",(ulong)uVar6);
    iVar5 = clock_gettime(3,&local_58);
    aVar9 = -1;
    lVar16 = -1;
    if (-1 < iVar5) {
      lVar16 = CONCAT44(local_58.tv_nsec._4_4_,(int)local_58.tv_nsec) / 1000 +
               CONCAT44(local_58.tv_sec._4_4_,(int)local_58.tv_sec) * 1000000;
    }
    fprintf(__stream,"%.2f",(double)(lVar16 - Gia_ManPrintMappingStats::clk) / 1000000.0);
    iVar5 = clock_gettime(3,&local_58);
    if (iVar5 < 0) goto LAB_0020c8ab;
  }
  else {
    strcpy(Gia_ManPrintMappingStats::FileNameOld,__s2);
    fputc(10,__stream);
    fprintf(__stream,"%s ",p->pName);
    fputc(0x20,__stream);
    fprintf(__stream,"%d ",(ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
    fprintf(__stream,"%d ",uVar15);
    uVar6 = Gia_ManLutLevelWithBoxes(p);
    fprintf(__stream,"%d ",(ulong)uVar6);
    iVar5 = clock_gettime(3,&local_58);
    if (iVar5 < 0) {
      aVar9 = -1;
      goto LAB_0020c8ab;
    }
  }
  aVar9 = CONCAT44(local_58.tv_nsec._4_4_,(int)local_58.tv_nsec) / 1000 +
          CONCAT44(local_58.tv_sec._4_4_,(int)local_58.tv_sec) * 1000000;
LAB_0020c8ab:
  Gia_ManPrintMappingStats::clk = aVar9;
  fclose(__stream);
  return;
}

Assistant:

void Gia_ManPrintMappingStats( Gia_Man_t * p, char * pDumpFile )
{
    Gia_Obj_t * pObj;
    int * pLevels;
    int i, k, iFan, nLutSize = 0, nLuts = 0, nFanins = 0, LevelMax = 0, Ave = 0, nMuxF = 0;
    if ( !Gia_ManHasMapping(p) )
        return;
    pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
    {
        if ( Gia_ObjLutIsMux(p, i) )
        {
            int pFanins[3];
            if ( Gia_ObjLutSize(p, i) == 3 )
            {
                Gia_ManPrintGetMuxFanins( p, Gia_ManObj(p, i), pFanins );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[pFanins[0]]+1 );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[pFanins[1]] );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[pFanins[2]] );
            }
            else if ( Gia_ObjLutSize(p, i) == 2 )
            {
                pObj = Gia_ManObj( p, i );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[Gia_ObjFaninId0(pObj, i)] );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[Gia_ObjFaninId1(pObj, i)] );
            }
            LevelMax = Abc_MaxInt( LevelMax, pLevels[i] );
            nFanins++;
            nMuxF++;
            continue;
        }
        nLuts++;
        nFanins += Gia_ObjLutSize(p, i);
        nLutSize = Abc_MaxInt( nLutSize, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFanin( p, i, iFan, k )
            pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[iFan] );
        pLevels[i]++;
        LevelMax = Abc_MaxInt( LevelMax, pLevels[i] );
    }
    Gia_ManForEachCo( p, pObj, i )
        Ave += pLevels[Gia_ObjFaninId0p(p, pObj)];
    ABC_FREE( pLevels );

#ifdef WIN32
    {
    HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
    Abc_Print( 1, "Mapping (K=%d)  :  ", nLutSize );
    SetConsoleTextAttribute( hConsole, 14 ); // yellow
    Abc_Print( 1, "lut =%7d  ",  nLuts );
    if ( nMuxF )
    Abc_Print( 1, "muxF =%7d  ",  nMuxF );
    SetConsoleTextAttribute( hConsole, 10 ); // green
    Abc_Print( 1, "edge =%8d  ", nFanins );
    SetConsoleTextAttribute( hConsole, 12 ); // red
    Abc_Print( 1, "lev =%5d ",   LevelMax );
    Abc_Print( 1, "(%.2f)  ",    (float)Ave / Gia_ManCoNum(p) );
//    Abc_Print( 1, "over =%5.1f %%  ", 100.0 * Gia_ManComputeOverlap(p) / Gia_ManAndNum(p) );
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t *)p->pManTime) )
        Abc_Print( 1, "levB =%5d  ", Gia_ManLutLevelWithBoxes(p) );
    SetConsoleTextAttribute( hConsole, 7 );  // normal
    Abc_Print( 1, "mem =%5.2f MB", 4.0*(Gia_ManObjNum(p) + 2*nLuts + nFanins)/(1<<20) );
    Abc_Print( 1, "\n" );
    }
#else
    Abc_Print( 1, "Mapping (K=%d)  :  ", nLutSize );
    Abc_Print( 1, "%slut =%7d%s  ",  "\033[1;33m", nLuts,    "\033[0m" );  // yellow
    Abc_Print( 1, "%sedge =%8d%s  ", "\033[1;32m", nFanins,  "\033[0m" );  // green
    Abc_Print( 1, "%slev =%5d%s ",   "\033[1;31m", LevelMax, "\033[0m" );  // red
    Abc_Print( 1, "%s(%.2f)%s  ",    "\033[1;31m", (float)Ave / Gia_ManCoNum(p), "\033[0m" );
//    Abc_Print( 1, "over =%5.1f %%  ", 100.0 * Gia_ManComputeOverlap(p) / Gia_ManAndNum(p) );
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t *)p->pManTime) )
        Abc_Print( 1, "%slevB =%5d%s  ", "\033[1;31m", Gia_ManLutLevelWithBoxes(p), "\033[0m" );
    Abc_Print( 1, "mem =%5.2f MB", 4.0*(Gia_ManObjNum(p) + 2*nLuts + nFanins)/(1<<20) );
    Abc_Print( 1, "\n" );
#endif

    if ( nMuxF )
        Gia_ManCountDupLut( p );

    //return;
    if ( pDumpFile )
    {
        static char FileNameOld[1000] = {0};
        static abctime clk = 0;
        FILE * pTable = fopen( pDumpFile, "a+" );
        if ( strcmp( FileNameOld, p->pName ) )
        {
            sprintf( FileNameOld, "%s", p->pName );
            fprintf( pTable, "\n" );
            fprintf( pTable, "%s ", p->pName );
            fprintf( pTable, " " );
            fprintf( pTable, "%d ", Gia_ManAndNum(p) );
            fprintf( pTable, "%d ", nLuts           );
            fprintf( pTable, "%d ", Gia_ManLutLevelWithBoxes(p) );
            //fprintf( pTable, "%d ", Gia_ManRegBoxNum(p) );
            //fprintf( pTable, "%d ", Gia_ManNonRegBoxNum(p) );
            //fprintf( pTable, "%.2f", 1.0*(Abc_Clock() - clk)/CLOCKS_PER_SEC );
            clk = Abc_Clock();
        }
        else
        {
            //printf( "This part of the code is currently not used.\n" );
            //assert( 0 );
            fprintf( pTable, " " );
            fprintf( pTable, "%d ", nLuts           );
            fprintf( pTable, "%d ", Gia_ManLutLevelWithBoxes(p) );
            //fprintf( pTable, "%d ", Gia_ManRegBoxNum(p) );
            //fprintf( pTable, "%d ", Gia_ManNonRegBoxNum(p) );
            fprintf( pTable, "%.2f", 1.0*(Abc_Clock() - clk)/CLOCKS_PER_SEC );
            clk = Abc_Clock();
        }
        fclose( pTable );
    }

}